

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmutex.cpp
# Opt level: O3

void __thiscall QBasicMutex::destroyInternal(QBasicMutex *this,void *ptr)

{
  if (ptr == (void *)0x0) {
    return;
  }
  destroyInternal();
  return;
}

Assistant:

void QBasicMutex::destroyInternal(void *ptr)
{
    auto d = static_cast<QMutexPrivate *>(ptr);
    if (!d)
        return;
    if (!futexAvailable()) {
        if (d != dummyLocked() && d->possiblyUnlocked.loadRelaxed() && tryLock()) {
            unlock();
            return;
        }
    }
    qWarning("QMutex: destroying locked mutex");
}